

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_version_negotiation.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  pcp_fstate_e pVar2;
  pcp_ctx_t *ctx;
  sockaddr *pcp_server;
  pcp_flow_t *flow;
  pcp_flow_info_t *__ptr;
  pcp_server_t *ppVar3;
  char *pcVar4;
  undefined8 uStackY_1c0;
  size_t flow_count;
  sockaddr_storage ext;
  sockaddr_storage source;
  sockaddr_storage destination;
  
  if (argc != 2) {
    pcp_log_level = PCP_LOGLVL_NONE;
    puts("Invalid number of arguments.");
    puts("This test takes only one argument, PCP version number.");
    return -1;
  }
  iVar1 = atoi(argv[1]);
  pcp_log_level = PCP_LOGLVL_NONE;
  putchar(10);
  fwrite("###########################################\n",0x2c,1,_stdout);
  puts("####   *****************************   ####");
  puts("####   * Begin version negotiation *   ####");
  puts("####   *           test            *   ####");
  puts("####   *****************************   ####");
  puts("###########################################");
  printf(">>> PCP server version =  %d \n");
  ctx = pcp_init('\0',(pcp_socket_vt_t *)0x0);
  pcp_server = Sock_pton("127.0.0.1:5351");
  pcp_add_server(ctx,pcp_server,(uint8_t)iVar1);
  sock_pton("127.0.0.1:1234",(sockaddr *)&destination);
  sock_pton("127.0.0.1:1235",(sockaddr *)&source);
  sock_pton("10.20.30.40",(sockaddr *)&ext);
  flow = pcp_new_flow(ctx,(sockaddr *)&source,(sockaddr *)&destination,(sockaddr *)&ext,'\x06',10,
                      (void *)0x0);
  pVar2 = pcp_wait(flow,2000,0);
  if (pVar2 == pcp_state_succeeded) {
    __ptr = pcp_flow_get_info(flow,&flow_count);
    if (__ptr == (pcp_flow_info_t *)0x0) {
      pcVar4 = "flow_info";
      uStackY_1c0 = 0x51;
    }
    else {
      printf("Flow result code %d \n",(ulong)__ptr->pcp_result_code);
      ppVar3 = get_pcp_server(ctx,flow->pcp_server_indx);
      if ((ppVar3 != (pcp_server_t *)0x0) && (ppVar3->pcp_version == '\x01')) {
        pcp_close_flow(flow);
        pcp_delete_flow(flow);
        free(__ptr);
        pcp_terminate(ctx,0);
        return 0;
      }
      pcVar4 = "(s) && (s->pcp_version == 1)";
      uStackY_1c0 = 0x54;
    }
  }
  else {
    pcVar4 = "pcp_wait(flow, 2000, 0) == pcp_state_succeeded";
    uStackY_1c0 = 0x4f;
  }
  printf("%s:%d Test \'%s\' failed!\n",
         "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/tests/test_version_negotiation.c"
         ,uStackY_1c0,pcVar4);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
    struct sockaddr_storage destination;
    struct sockaddr_storage source;
    struct sockaddr_storage ext;
    int version;
    pcp_server_t *s;
    uint8_t protocol = 6;
    uint32_t lifetime = 10;
    pcp_flow_t *flow = NULL;
    pcp_flow_info_t *flow_info = NULL;
    size_t flow_count;
    pcp_ctx_t *ctx;

    PD_SOCKET_STARTUP();
    version = (argc == 2) ? (uint8_t)atoi(argv[1]) : PCP_MAX_SUPPORTED_VERSION;

    pcp_log_level = 0;

    if (argc != 2) { // LCOV_EXCL_START
        printf("Invalid number of arguments.\n");
        printf("This test takes only one argument, PCP version number.\n");
        return -1;
    } // LCOV_EXCL_STOP

    printf("\n");
    fprintf(stdout, "###########################################\n");
    printf("####   *****************************   ####\n");
    printf("####   * Begin version negotiation *   ####\n");
    printf("####   *           test            *   ####\n");
    printf("####   *****************************   ####\n");
    printf("###########################################\n");
    printf(">>> PCP server version =  %d \n", version);
    ctx = pcp_init(0, NULL);
    pcp_add_server(ctx, Sock_pton("127.0.0.1:5351"), version);

    sock_pton("127.0.0.1:1234", (struct sockaddr *)&destination);
    sock_pton("127.0.0.1:1235", (struct sockaddr *)&source);
    sock_pton("10.20.30.40", (struct sockaddr *)&ext);

    flow = pcp_new_flow(ctx, (struct sockaddr *)&source,
                        (struct sockaddr *)&destination,
                        (struct sockaddr *)&ext, protocol, lifetime, NULL);

    TEST(pcp_wait(flow, 2000, 0) == pcp_state_succeeded);
    flow_info = pcp_flow_get_info(flow, &flow_count);
    TEST(flow_info);
    printf("Flow result code %d \n", flow_info->pcp_result_code);
    s = get_pcp_server(ctx, flow->pcp_server_indx);
    TEST((s) && (s->pcp_version == 1));

    pcp_close_flow(flow);
    pcp_delete_flow(flow);
    flow = NULL;
    free(flow_info);

    PD_SOCKET_CLEANUP();
    pcp_terminate(ctx, 0);
    return 0;
}